

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobjectcleanuphandler.cpp
# Opt level: O0

void __thiscall QObjectCleanupHandler::~QObjectCleanupHandler(QObjectCleanupHandler *this)

{
  QObjectCleanupHandler *in_RDI;
  
  ~QObjectCleanupHandler(in_RDI);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

QObjectCleanupHandler::~QObjectCleanupHandler()
{
    clear();
}